

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianEdgeCalculator.cpp
# Opt level: O3

bool __thiscall
GaussianEdgeCalculator::edgeBetween
          (GaussianEdgeCalculator *this,AlignmentRecord *ap1,AlignmentRecord *ap2,
          int numGCAllowedPos,int ct)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  runtime_error *this_00;
  int iVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  
  bVar2 = AlignmentRecord::isSingleEnd(ap1);
  if ((bVar2) || (bVar2 = AlignmentRecord::isSingleEnd(ap2), bVar2)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Cannot process single-end reads in GaussianEdgeCalculator!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar3 = AlignmentRecord::getInsertLength(ap1);
  uVar4 = AlignmentRecord::getInsertLength(ap2);
  iVar7 = uVar3 - uVar4;
  iVar1 = -iVar7;
  if (0 < iVar7) {
    iVar1 = iVar7;
  }
  if ((iVar1 <= this->allowable_insert_size_diff) &&
     (sVar5 = AlignmentRecord::internalSegmentIntersectionLength(ap1,ap2), sVar5 != 0)) {
    uVar3 = AlignmentRecord::getInsertLength(ap1);
    uVar4 = AlignmentRecord::getInsertLength(ap2);
    auVar10._8_4_ = (int)(sVar5 >> 0x20);
    auVar10._0_8_ = sVar5;
    auVar10._12_4_ = 0x45300000;
    dVar8 = ((((double)(uVar4 + uVar3) * 0.5 -
              ((auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0))) -
             this->insert_size_popmean) * 1.4142135623730951) / this->insert_size_popstddev;
    if (0.0 <= dVar8) {
      dVar9 = floor(dVar8 / 0.001);
      dVar8 = 0.0;
      uVar6 = (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f | (long)dVar9;
      if (uVar6 < 0x9664) {
        dVar8 = this->cached_survival_function[uVar6];
      }
    }
    else {
      dVar8 = ceil(dVar8 / -0.001);
      uVar6 = (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f | (long)dVar8;
      if (uVar6 < 0x9664) {
        dVar8 = 1.0 - this->cached_survival_function[uVar6];
      }
      else {
        dVar8 = 1.0;
      }
    }
    dVar8 = dVar8 + dVar8;
    if (1.0 <= dVar8) {
      dVar8 = 1.0;
    }
    return this->significance_level <= dVar8;
  }
  return false;
}

Assistant:

bool GaussianEdgeCalculator::edgeBetween(const AlignmentRecord & ap1, const AlignmentRecord & ap2, int numGCAllowedPos, int ct) const {
	if (ap1.isSingleEnd() || ap2.isSingleEnd()) {
		throw runtime_error("Cannot process single-end reads in GaussianEdgeCalculator!");
	}
	double insert_length_diff = abs(((int)ap1.getInsertLength()) - ((int)ap2.getInsertLength()));
	// double meanedge = 2.0 * sf( insert_length_diff / (sqrt2*insert_size_popstddev) );
	if (insert_length_diff > allowable_insert_size_diff) {
		return false;
	}
	size_t intersection_length = ap1.internalSegmentIntersectionLength(ap2);
	if (intersection_length == 0) return false;
	double mean_insert_length = (ap1.getInsertLength() + ap2.getInsertLength()) / 2.0;
	double interedge = min(1.0, 2.0 * sf(sqrt2*(mean_insert_length - intersection_length - insert_size_popmean) / insert_size_popstddev) );
	return interedge >= significance_level;
}